

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O3

void work_mgga_fxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  double *pdVar13;
  size_t sVar14;
  uint unaff_R15D;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  undefined1 auVar64 [16];
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  undefined1 auVar102 [16];
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar127;
  undefined1 auVar126 [16];
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar173;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  double dVar174;
  double dVar175;
  double __x;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double local_f30;
  double local_eb8;
  double local_e48;
  double local_d98;
  double local_d28;
  double local_b58;
  double local_9b8;
  double local_9a8;
  double local_8e8;
  double local_668;
  
  if (np != 0) {
    iVar2 = p->nspin;
    iVar3 = (p->dim).rho;
    pdVar13 = rho + 1;
    sVar14 = 0;
    local_d98 = 0.0;
    dVar243 = 0.0;
    local_f30 = 0.0;
    __x = 0.0;
    do {
      dVar23 = pdVar13[-1];
      if (iVar2 == 2) {
        dVar23 = dVar23 + *pdVar13;
      }
      dVar125 = p->dens_threshold;
      if (dVar125 <= dVar23) {
        dVar23 = pdVar13[-1];
        if (pdVar13[-1] <= dVar125) {
          dVar23 = dVar125;
        }
        dVar24 = p->sigma_threshold * p->sigma_threshold;
        lVar9 = (long)(p->dim).sigma * sVar14;
        local_eb8 = sigma[lVar9];
        if (sigma[lVar9] <= dVar24) {
          local_eb8 = dVar24;
        }
        uVar4 = p->info->flags;
        if ((uVar4 >> 0x10 & 1) == 0) {
          if (iVar2 == 2) {
            __x = *pdVar13;
            if (*pdVar13 <= dVar125) {
              __x = dVar125;
            }
            local_f30 = sigma[lVar9 + 2];
            if (sigma[lVar9 + 2] <= dVar24) {
              local_f30 = dVar24;
            }
          }
        }
        else {
          dVar176 = p->tau_threshold;
          lVar11 = (long)(p->dim).tau * sVar14;
          dVar243 = tau[lVar11];
          if (tau[lVar11] <= dVar176) {
            dVar243 = dVar176;
          }
          if (((uVar4 >> 0x11 & 1) != 0) && (dVar65 = dVar23 * 8.0 * dVar243, dVar65 <= local_eb8))
          {
            local_eb8 = dVar65;
          }
          if (iVar2 == 2) {
            __x = *pdVar13;
            if (*pdVar13 <= dVar125) {
              __x = dVar125;
            }
            local_f30 = sigma[lVar9 + 2];
            if (sigma[lVar9 + 2] <= dVar24) {
              local_f30 = dVar24;
            }
            local_d98 = tau[lVar11 + 1];
            if (tau[lVar11 + 1] <= dVar176) {
              local_d98 = dVar176;
            }
            if (((uVar4 >> 0x11 & 1) != 0) && (dVar24 = __x * 8.0 * local_d98, dVar24 <= local_f30))
            {
              local_f30 = dVar24;
            }
          }
        }
        auVar172._8_8_ = -(ulong)(dVar23 <= dVar125);
        auVar172._0_8_ = -(ulong)(__x <= dVar125);
        dVar65 = dVar23 + __x;
        dVar146 = 1.0 / dVar65;
        dVar66 = (dVar23 + dVar23) * dVar146;
        dVar24 = p->zeta_threshold;
        local_e48 = dVar24 + -1.0;
        dVar199 = (__x + __x) * dVar146;
        dVar147 = dVar23 - __x;
        uVar19 = -(ulong)(dVar199 <= dVar24);
        dVar176 = local_e48;
        if (dVar24 < dVar66) {
          dVar176 = (double)(~uVar19 & (ulong)(dVar147 * dVar146) | uVar19 & (ulong)-local_e48);
        }
        unaff_R15D = movmskpd(unaff_R15D,auVar172);
        pdVar5 = (double *)p->params;
        dVar176 = dVar176 + 1.0;
        dVar25 = cbrt(dVar24);
        dVar26 = cbrt(dVar176);
        dVar27 = cbrt(dVar65);
        dVar67 = pdVar5[0xc] * dVar27;
        dVar28 = cbrt(9.869604401089358);
        dVar29 = cbrt(dVar23);
        uVar20 = -(ulong)(dVar176 <= dVar24);
        dVar161 = (double)(uVar20 & (ulong)(dVar25 * dVar24) | ~uVar20 & (ulong)(dVar26 * dVar176));
        dVar68 = 1.0 / (dVar28 * dVar28);
        dVar69 = dVar68 * 1.8171205928321397;
        dVar103 = dVar23 * dVar23;
        dVar200 = dVar28 * dVar28 * 0.9905781746683879;
        dVar70 = 1.0 / (dVar29 * dVar29);
        dVar177 = dVar70 / dVar23;
        dVar225 = dVar200 - dVar243 * dVar177;
        dVar71 = dVar70 / dVar103;
        dVar148 = local_eb8 * dVar69 * 0.009146457198521547 * dVar71 + 0.804;
        dVar104 = 1.804 - 0.646416 / dVar148;
        dVar30 = dVar243 * dVar177 + dVar200;
        dVar72 = dVar30 * dVar30;
        dVar244 = dVar72 * dVar72;
        dVar178 = 1.0 / (dVar244 * dVar244);
        dVar212 = dVar225 * dVar225;
        dVar201 = dVar212 * dVar212;
        dVar149 = dVar201 * dVar225;
        dVar173 = dVar201 * dVar201;
        dVar216 = dVar225 * dVar173;
        dVar1 = pdVar5[2];
        dVar60 = pdVar5[9];
        dVar222 = dVar212 * dVar1;
        dVar224 = dVar216 * dVar60;
        auVar171._8_8_ = dVar178;
        auVar171._0_8_ = 0x3ff0000000000000;
        auVar197._8_8_ = dVar30;
        auVar197._0_8_ = dVar30 * dVar244;
        auVar196._8_8_ = dVar178;
        auVar196._0_8_ = 0x3ff0000000000000;
        auVar197 = divpd(auVar196,auVar197);
        dVar105 = 1.0 / dVar30;
        dVar106 = 1.0 / dVar72;
        dVar31 = dVar30 * dVar72;
        auVar221._0_8_ = dVar72 * dVar244;
        auVar221._8_8_ = dVar72;
        auVar220._8_8_ = dVar178;
        auVar220._0_8_ = 0x3ff0000000000000;
        auVar221 = divpd(auVar220,auVar221);
        dVar73 = 1.0 / dVar31;
        auVar102._0_8_ = dVar244 * dVar31;
        auVar102._8_8_ = dVar31;
        auVar172 = divpd(auVar171,auVar102);
        dVar107 = dVar161 * 0.9847450218426964;
        dVar74 = dVar212 * dVar201;
        dVar31 = pdVar5[6];
        dVar75 = dVar74 * dVar31;
        dVar72 = pdVar5[1];
        dVar32 = dVar72 * dVar225;
        dVar33 = 1.0 / dVar244;
        dVar226 = dVar225 * dVar212;
        dVar61 = pdVar5[3];
        dVar34 = dVar61 * dVar226;
        dVar35 = dVar201 * dVar226;
        dVar63 = pdVar5[10];
        dVar76 = dVar212 * dVar173 * dVar63;
        dVar57 = pdVar5[0xb];
        dVar235 = dVar173 * dVar57 * dVar226;
        dVar198 = auVar197._8_8_;
        dVar215 = auVar221._8_8_;
        dVar175 = auVar172._8_8_;
        dVar36 = -dVar147;
        uVar21 = -(ulong)(dVar66 <= dVar24);
        if (dVar24 < dVar199) {
          local_e48 = (double)(~uVar21 & (ulong)(dVar146 * dVar36) | (ulong)-local_e48 & uVar21);
        }
        dVar37 = dVar107 * -0.375;
        uVar7 = unaff_R15D >> 1;
        dVar111 = *pdVar5;
        dVar58 = pdVar5[7];
        dVar59 = pdVar5[8];
        local_e48 = local_e48 + 1.0;
        dVar38 = cbrt(local_e48);
        uVar22 = -(ulong)(local_e48 <= dVar24);
        dVar169 = (double)((ulong)(dVar25 * dVar24) & uVar22 | ~uVar22 & (ulong)(local_e48 * dVar38)
                          );
        dVar39 = dVar169 * 0.9847450218426964;
        dVar77 = __x * __x;
        dVar40 = cbrt(__x);
        dVar227 = 1.0 / (dVar40 * dVar40);
        dVar41 = dVar227 / dVar77;
        dVar78 = dVar69 * 0.009146457198521547 * local_f30 * dVar41 + 0.804;
        dVar79 = 1.804 - 0.646416 / dVar78;
        dVar228 = dVar227 / __x;
        dVar202 = dVar200 - local_d98 * dVar228;
        dVar80 = dVar72 * dVar202;
        dVar200 = local_d98 * dVar228 + dVar200;
        dVar81 = 1.0 / dVar200;
        dVar25 = pdVar5[4];
        dVar62 = pdVar5[5];
        dVar150 = dVar25 * dVar201;
        dVar174 = dVar58 * dVar35;
        dVar128 = dVar62 * dVar149;
        dVar145 = dVar59 * dVar173;
        local_b58 = auVar197._0_8_;
        local_9b8 = auVar221._0_8_;
        local_9a8 = auVar172._0_8_;
        dVar108 = dVar202 * dVar202;
        dVar82 = dVar1 * dVar108;
        dVar129 = dVar200 * dVar200;
        dVar83 = 1.0 / dVar129;
        dVar203 = dVar202 * dVar108;
        dVar84 = dVar61 * dVar203;
        dVar151 = dVar200 * dVar129;
        dVar85 = 1.0 / dVar151;
        dVar245 = dVar129 * dVar129;
        dVar86 = 1.0 / dVar245;
        dVar179 = dVar174 * local_9a8 +
                  dVar75 * local_9b8 +
                  dVar128 * local_b58 +
                  dVar150 * dVar33 +
                  dVar34 * dVar73 +
                  dVar222 * dVar106 +
                  dVar32 * dVar105 +
                  dVar235 * dVar175 + dVar76 * dVar215 + dVar145 * dVar178 + dVar198 * dVar224 +
                  dVar111;
        dVar87 = dVar104 * dVar179;
        dVar109 = dVar67 * dVar87;
        dVar88 = 0.0;
        dVar110 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          dVar110 = dVar37 * dVar109;
        }
        dVar229 = dVar108 * dVar108;
        dVar180 = dVar202 * dVar229;
        dVar236 = dVar229 * dVar25;
        dVar237 = dVar180 * dVar62;
        dVar204 = 1.0 / (dVar200 * dVar245);
        dVar181 = dVar108 * dVar229;
        dVar238 = dVar31 * dVar181;
        dVar217 = 1.0 / (dVar129 * dVar245);
        dVar223 = 1.0 / (dVar245 * dVar151);
        dVar246 = 1.0 / (dVar245 * dVar245);
        dVar248 = dVar246 / dVar200;
        dVar129 = dVar246 / dVar129;
        dVar151 = dVar246 / dVar151;
        dVar152 = dVar229 * dVar203;
        dVar42 = dVar58 * dVar152;
        dVar230 = dVar229 * dVar229;
        dVar130 = dVar59 * dVar230;
        dVar213 = dVar202 * dVar230;
        dVar43 = dVar60 * dVar213;
        dVar153 = dVar63 * dVar108 * dVar230;
        dVar44 = dVar57 * dVar230 * dVar203;
        dVar111 = dVar111 + dVar44 * dVar151 +
                            dVar153 * dVar129 +
                            dVar43 * dVar248 +
                            dVar130 * dVar246 +
                            dVar42 * dVar223 +
                            dVar238 * dVar217 +
                            dVar237 * dVar204 +
                            dVar236 * dVar86 + dVar84 * dVar85 + dVar80 * dVar81 + dVar82 * dVar83;
        dVar45 = dVar79 * dVar111;
        dVar112 = dVar67 * dVar45;
        dVar46 = dVar39 * -0.375;
        if ((unaff_R15D & 1) == 0) {
          dVar88 = dVar46 * dVar112;
        }
        dVar110 = dVar110 + dVar88;
        pdVar6 = out->zk;
        if ((uVar4 & 1) != 0 && pdVar6 != (double *)0x0) {
          lVar9 = (long)(p->dim).zk * sVar14;
          pdVar6[lVar9] = pdVar6[lVar9] + dVar110;
        }
        dVar88 = 1.0 / (dVar65 * dVar65);
        bVar17 = dVar24 < dVar199;
        bVar18 = dVar24 < dVar66;
        dVar47 = 0.0;
        local_8e8 = 0.0;
        if (bVar18 && bVar17) {
          dVar47 = dVar146 - dVar147 * dVar88;
        }
        dVar89 = dVar26 * 1.3333333333333333;
        dVar113 = (double)(~uVar20 & (ulong)(dVar89 * dVar47));
        dVar90 = 1.0 / (dVar27 * dVar27);
        dVar231 = 1.0 / (dVar148 * dVar148);
        dVar114 = dVar1 * dVar225;
        dVar154 = dVar173 * dVar60;
        dVar205 = dVar216 * dVar63;
        dVar239 = dVar178 / dVar244;
        dVar218 = dVar243 * dVar106;
        dVar27 = dVar71 * dVar243 * dVar73;
        dVar115 = dVar61 * dVar212;
        dVar131 = dVar71 * dVar243 * dVar33;
        dVar91 = dVar25 * dVar226;
        dVar155 = dVar71 * dVar243 * local_b58;
        dVar206 = dVar62 * dVar201;
        dVar92 = dVar71 * dVar243 * local_9b8;
        dVar116 = dVar149 * dVar31;
        dVar127 = dVar35 * dVar59;
        dVar132 = dVar71 * dVar243 * local_9a8;
        dVar156 = dVar74 * dVar58;
        dVar157 = dVar71 * dVar243 * dVar178;
        dVar158 = dVar71 * dVar243 * dVar198;
        dVar159 = dVar71 * dVar243 * dVar215;
        dVar160 = dVar71 * dVar243 * dVar175;
        dVar133 = dVar212 * dVar173 * dVar57;
        dVar159 = dVar243 * dVar239 * dVar235 * 18.333333333333332 * dVar71 +
                  dVar160 * dVar133 * 18.333333333333332 +
                  dVar76 * 16.666666666666668 * dVar160 +
                  dVar205 * 16.666666666666668 * dVar159 +
                  dVar224 * 15.0 * dVar159 +
                  dVar154 * 15.0 * dVar158 +
                  dVar145 * 13.333333333333334 * dVar158 +
                  dVar127 * 13.333333333333334 * dVar157 +
                  dVar174 * 11.666666666666666 * dVar157 +
                  dVar132 * dVar75 * 10.0 + dVar156 * 11.666666666666666 * dVar132 +
                  dVar92 * dVar116 * 10.0 +
                  dVar128 * 8.333333333333334 * dVar92 +
                  dVar155 * dVar206 * 8.333333333333334 +
                  dVar150 * 6.666666666666667 * dVar155 +
                  dVar131 * dVar91 * 6.666666666666667 +
                  dVar34 * 5.0 * dVar131 +
                  dVar27 * dVar115 * 5.0 +
                  dVar222 * 3.3333333333333335 * dVar27 +
                  dVar71 * dVar218 * dVar114 * 3.3333333333333335 +
                  dVar243 * dVar72 * 1.6666666666666667 * dVar71 * dVar105 +
                  dVar32 * 1.6666666666666667 * dVar71 * dVar218;
        dVar27 = dVar113 * 0.9847450218426964;
        dVar157 = pdVar5[0xc] * dVar90;
        dVar92 = dVar87 * dVar157;
        dVar160 = dVar107 * dVar92 * 0.125;
        dVar161 = dVar161 * 1.4422495703074083;
        dVar131 = dVar67 * dVar231;
        dVar162 = dVar161 * dVar131;
        dVar163 = dVar23 * dVar103;
        dVar182 = dVar70 / dVar163;
        dVar132 = local_eb8 * dVar182 * dVar69;
        dVar155 = dVar132 * dVar179;
        dVar158 = dVar67 * dVar104 * dVar159;
        if ((uVar7 & 0x7f) == 0) {
          local_8e8 = dVar37 * dVar158 +
                      dVar162 * 0.0040369036088841095 * dVar155 +
                      (dVar27 * -0.375 * dVar109 - dVar160);
        }
        dVar207 = 0.0;
        dVar48 = 0.0;
        if (dVar24 < dVar199) {
          dVar48 = (double)(~uVar21 & (ulong)(-dVar146 - dVar88 * dVar36));
        }
        dVar240 = dVar38 * 1.3333333333333333;
        dVar214 = (double)(~uVar22 & (ulong)(dVar240 * dVar48));
        dVar183 = dVar214 * 0.9847450218426964;
        dVar199 = dVar45 * dVar157;
        dVar49 = dVar183 * -0.375;
        dVar93 = dVar39 * dVar199 * -0.125;
        if ((unaff_R15D & 1) == 0) {
          dVar207 = dVar49 * dVar112 + dVar93;
        }
        pdVar6 = out->vrho;
        bVar15 = (uVar4 & 2) != 0;
        if (bVar15 && pdVar6 != (double *)0x0) {
          lVar9 = (long)(p->dim).vrho * sVar14;
          pdVar6[lVar9] = dVar65 * (local_8e8 + dVar207) + dVar110 + pdVar6[lVar9];
        }
        dVar232 = 0.0;
        dVar117 = 0.0;
        if (dVar24 < dVar66) {
          dVar117 = (double)(~uVar19 & (ulong)(-dVar146 - dVar147 * dVar88));
        }
        dVar184 = (double)(~uVar20 & (ulong)(dVar89 * dVar117));
        dVar66 = dVar184 * 0.9847450218426964;
        dVar50 = dVar66 * -0.375;
        local_668 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          local_668 = dVar50 * dVar109 - dVar160;
        }
        dVar160 = 0.0;
        if (bVar18 && bVar17) {
          dVar160 = dVar146 - dVar88 * dVar36;
        }
        dVar250 = (double)(~uVar22 & (ulong)(dVar160 * dVar240));
        dVar185 = 1.0 / (dVar78 * dVar78);
        dVar146 = local_d98 * dVar83;
        dVar241 = dVar1 * dVar202;
        dVar134 = dVar41 * local_d98 * dVar85;
        dVar247 = dVar61 * dVar108;
        dVar51 = dVar41 * local_d98 * dVar86;
        dVar135 = dVar25 * dVar203;
        dVar136 = dVar41 * local_d98 * dVar204;
        dVar52 = dVar62 * dVar229;
        dVar53 = dVar41 * local_d98 * dVar217;
        dVar137 = dVar31 * dVar180;
        dVar186 = dVar246 / dVar245;
        dVar138 = dVar41 * local_d98 * dVar223;
        dVar164 = dVar58 * dVar181;
        dVar165 = dVar41 * local_d98 * dVar246;
        dVar139 = dVar59 * dVar152;
        dVar140 = dVar41 * local_d98 * dVar248;
        dVar166 = dVar60 * dVar230;
        dVar167 = dVar41 * local_d98 * dVar129;
        dVar141 = dVar63 * dVar213;
        dVar142 = dVar41 * local_d98 * dVar151;
        dVar168 = dVar108 * dVar230 * dVar57;
        dVar134 = dVar44 * 18.333333333333332 * local_d98 * dVar186 * dVar41 +
                  dVar142 * dVar168 * 18.333333333333332 +
                  dVar153 * 16.666666666666668 * dVar142 +
                  dVar167 * dVar141 * 16.666666666666668 +
                  dVar43 * 15.0 * dVar167 +
                  dVar140 * dVar166 * 15.0 +
                  dVar130 * 13.333333333333334 * dVar140 +
                  dVar165 * dVar139 * 13.333333333333334 +
                  dVar42 * 11.666666666666666 * dVar165 +
                  dVar138 * dVar238 * 10.0 + dVar164 * 11.666666666666666 * dVar138 +
                  dVar53 * dVar137 * 10.0 +
                  dVar237 * 8.333333333333334 * dVar53 +
                  dVar136 * dVar52 * 8.333333333333334 +
                  dVar236 * 6.666666666666667 * dVar136 +
                  dVar51 * dVar135 * 6.666666666666667 +
                  dVar84 * 5.0 * dVar51 +
                  dVar134 * dVar247 * 5.0 +
                  dVar82 * 3.3333333333333335 * dVar134 +
                  dVar41 * dVar146 * dVar241 * 3.3333333333333335 +
                  local_d98 * dVar72 * 1.6666666666666667 * dVar41 * dVar81 +
                  dVar80 * 1.6666666666666667 * dVar41 * dVar146;
        dVar51 = dVar250 * 0.9847450218426964;
        dVar169 = dVar169 * 1.4422495703074083;
        dVar165 = dVar67 * dVar185;
        dVar136 = dVar169 * dVar165;
        dVar138 = __x * dVar77;
        dVar167 = dVar227 / dVar138;
        dVar140 = local_f30 * dVar167 * dVar69;
        dVar142 = dVar140 * dVar111;
        dVar53 = dVar67 * dVar79 * dVar134;
        if ((unaff_R15D & 1) == 0) {
          dVar232 = dVar46 * dVar53 +
                    dVar136 * 0.0040369036088841095 * dVar142 + dVar51 * -0.375 * dVar112 + dVar93;
        }
        if (bVar15 && pdVar6 != (double *)0x0) {
          lVar9 = (long)(p->dim).vrho * sVar14;
          pdVar6[lVar9 + 1] = (local_668 + dVar232) * dVar65 + dVar110 + pdVar6[lVar9 + 1];
        }
        bVar15 = (uVar4 & 2) != 0;
        dVar94 = dVar67 * dVar161;
        dVar110 = dVar68 * dVar71 * dVar231 * 1.8171205928321397;
        dVar93 = dVar110 * dVar179;
        dVar54 = dVar94 * -0.0015138388533315413;
        dVar118 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          dVar118 = dVar54 * dVar93;
        }
        pdVar6 = out->vsigma;
        if (bVar15 && pdVar6 != (double *)0x0) {
          lVar9 = (long)(p->dim).vsigma * sVar14;
          dVar55 = (pdVar6 + lVar9)[1];
          pdVar6[lVar9] = dVar65 * dVar118 + pdVar6[lVar9];
          (pdVar6 + lVar9)[1] = dVar55 + 0.0;
        }
        dVar95 = dVar67 * dVar169;
        dVar55 = dVar68 * dVar41 * dVar185 * 1.8171205928321397;
        dVar119 = dVar55 * dVar111;
        dVar56 = dVar95 * -0.0015138388533315413;
        dVar96 = 0.0;
        if ((unaff_R15D & 1) == 0) {
          dVar96 = dVar56 * dVar119;
        }
        if (bVar15 && pdVar6 != (double *)0x0) {
          lVar9 = (long)(p->dim).vsigma * sVar14;
          pdVar6[lVar9 + 2] = dVar65 * dVar96 + pdVar6[lVar9 + 2];
        }
        pdVar6 = out->vlapl;
        uVar8 = ~uVar4;
        if ((uVar8 & 0x8002) == 0 && pdVar6 != (double *)0x0) {
          lVar9 = (long)(p->dim).vlapl * sVar14;
          dVar97 = (pdVar6 + lVar9)[1];
          pdVar6[lVar9] = pdVar6[lVar9] + 0.0;
          (pdVar6 + lVar9)[1] = dVar97 + 0.0;
        }
        dVar120 = dVar145 * -8.0 * dVar177 * dVar198 +
                  dVar174 * -7.0 * dVar177 * dVar178 +
                  dVar75 * -6.0 * dVar177 * local_9a8 +
                  dVar133 * -11.0 * dVar177 * dVar175 +
                  dVar205 * -10.0 * dVar177 * dVar215 +
                  dVar154 * -9.0 * dVar177 * dVar198 +
                  dVar127 * -8.0 * dVar177 * dVar178 +
                  dVar156 * -7.0 * dVar177 * local_9a8 +
                  dVar76 * -10.0 * dVar177 * dVar175 +
                  dVar235 * -11.0 * dVar239 * dVar177 + dVar224 * -9.0 * dVar177 * dVar215 +
                  dVar128 * -5.0 * dVar177 * local_9b8 +
                  dVar150 * -4.0 * dVar177 * local_b58 +
                  dVar34 * -3.0 * dVar177 * dVar33 +
                  dVar222 * -2.0 * dVar177 * dVar73 +
                  ((dVar116 * -6.0 * dVar177 * local_9b8 +
                   dVar206 * -5.0 * dVar177 * local_b58 +
                   dVar91 * -4.0 * dVar177 * dVar33 +
                   dVar115 * -3.0 * dVar177 * dVar73 +
                   (dVar114 * -2.0 * dVar177 * dVar106 - dVar177 * dVar72 * dVar105)) -
                  dVar177 * dVar106 * dVar32);
        dVar177 = dVar67 * dVar104 * dVar120;
        dVar97 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          dVar97 = dVar37 * dVar177;
        }
        pdVar6 = out->vtau;
        bVar15 = (uVar8 & 0x10002) == 0;
        if (bVar15 && pdVar6 != (double *)0x0) {
          lVar9 = (long)(p->dim).vtau * sVar14;
          pdVar6[lVar9] = dVar65 * dVar97 + pdVar6[lVar9];
        }
        dVar98 = dVar168 * -11.0 * dVar228 * dVar151 +
                 dVar141 * -10.0 * dVar228 * dVar129 +
                 dVar166 * -9.0 * dVar228 * dVar248 +
                 dVar139 * -8.0 * dVar228 * dVar246 +
                 dVar164 * -7.0 * dVar228 * dVar223 +
                 dVar153 * -10.0 * dVar228 * dVar151 +
                 dVar43 * -9.0 * dVar228 * dVar129 +
                 dVar130 * -8.0 * dVar228 * dVar248 +
                 dVar42 * -7.0 * dVar228 * dVar246 +
                 dVar44 * -11.0 * dVar186 * dVar228 + dVar238 * -6.0 * dVar228 * dVar223 +
                 dVar137 * -6.0 * dVar228 * dVar217 +
                 dVar52 * -5.0 * dVar228 * dVar204 +
                 dVar135 * -4.0 * dVar228 * dVar86 +
                 dVar247 * -3.0 * dVar228 * dVar85 +
                 dVar241 * -2.0 * dVar228 * dVar83 +
                 dVar237 * -5.0 * dVar228 * dVar217 +
                 dVar236 * -4.0 * dVar228 * dVar204 +
                 dVar84 * -3.0 * dVar228 * dVar86 +
                 dVar82 * -2.0 * dVar228 * dVar85 +
                 (-dVar72 * dVar228 * dVar81 - dVar228 * dVar83 * dVar80);
        dVar121 = dVar79 * dVar98;
        dVar228 = dVar67 * dVar121;
        dVar187 = 0.0;
        if ((unaff_R15D & 1) == 0) {
          dVar187 = dVar46 * dVar228;
        }
        if (bVar15 && pdVar6 != (double *)0x0) {
          lVar9 = (long)(p->dim).vtau * sVar14;
          pdVar6[lVar9 + 1] = dVar65 * dVar187 + pdVar6[lVar9 + 1];
        }
        dVar26 = 1.0 / (dVar26 * dVar26);
        dVar99 = 1.0 / (dVar65 * dVar65 * dVar65);
        dVar147 = dVar147 * dVar99;
        dVar147 = dVar147 + dVar147;
        dVar170 = -0.0;
        if (dVar24 < dVar176) {
          dVar170 = 0.0;
          if (bVar18 && bVar17) {
            dVar170 = dVar147 - (dVar88 + dVar88);
          }
          dVar170 = (dVar170 * dVar89 + dVar26 * 0.4444444444444444 * dVar47 * dVar47) *
                    0.9847450218426964 * -0.375;
        }
        dVar113 = dVar113 * 1.4422495703074083;
        dVar100 = (dVar90 / dVar65) * pdVar5[0xc];
        dVar87 = (dVar87 * dVar100 * dVar107) / 12.0;
        dVar242 = dVar231 * dVar157 * dVar161 * dVar155;
        dVar90 = dVar104 * dVar159 * dVar157 * dVar107;
        auVar126._0_8_ = 1.0 / dVar28;
        auVar126._8_8_ = dVar231;
        auVar64._8_8_ = dVar148;
        auVar64._0_8_ = 0x4023bd3cc9be45de;
        auVar172 = divpd(auVar126,auVar64);
        dVar148 = auVar172._0_8_;
        dVar219 = auVar172._8_8_ * dVar67 * dVar161;
        dVar122 = dVar148 * 3.3019272488946267;
        dVar123 = dVar103 * dVar103;
        dVar29 = 1.0 / dVar29;
        dVar28 = dVar29 / (dVar23 * dVar123);
        dVar225 = dVar225 * dVar61;
        dVar212 = dVar212 * dVar25;
        dVar226 = dVar226 * dVar62;
        dVar201 = dVar201 * dVar31;
        dVar173 = dVar173 * dVar63;
        dVar216 = dVar216 * dVar57;
        dVar74 = dVar74 * dVar59;
        dVar35 = dVar35 * dVar60;
        dVar30 = dVar178 / (dVar30 * dVar244);
        dVar149 = dVar149 * dVar58;
        dVar244 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          dVar249 = dVar243 * dVar243;
          dVar208 = dVar243 * dVar73 * dVar182;
          dVar209 = dVar243 * dVar33 * dVar182;
          dVar188 = dVar243 * dVar175 * dVar182;
          dVar189 = dVar243 * local_b58 * dVar182;
          dVar210 = dVar243 * local_9b8 * dVar182;
          dVar190 = dVar243 * local_9a8 * dVar182;
          dVar191 = dVar243 * dVar178 * dVar182;
          dVar192 = dVar243 * dVar198 * dVar182;
          dVar193 = dVar243 * dVar215 * dVar182;
          dVar143 = dVar249 * dVar73 * dVar28;
          dVar101 = dVar249 * dVar33 * dVar28;
          dVar233 = dVar249 * local_b58 * dVar28;
          dVar194 = dVar249 * local_9b8 * dVar28;
          dVar244 = dVar249 * local_9a8 * dVar28;
          dVar195 = dVar249 * dVar178 * dVar28;
          dVar144 = dVar249 * dVar215 * dVar28;
          dVar234 = dVar249 * dVar175 * dVar28;
          dVar211 = dVar249 * dVar239 * dVar28;
          dVar124 = dVar249 * dVar198 * dVar28;
          dVar244 = (dVar174 * 155.55555555555554 * dVar124 +
                     dVar156 * 272.22222222222223 * dVar195 +
                     dVar149 * 116.66666666666667 * dVar244 +
                     dVar249 * dVar30 * dVar235 * 366.6666666666667 * dVar28 +
                     dVar35 * 200.0 * dVar124 +
                     dVar145 * 200.0 * dVar144 +
                     dVar127 * 355.55555555555554 * dVar124 +
                     dVar74 * 155.55555555555554 * dVar195 +
                     dVar222 * 16.666666666666668 * dVar101 +
                     dVar133 * 672.2222222222222 * dVar211 +
                     dVar216 * 305.55555555555554 * dVar234 +
                     dVar76 * 305.55555555555554 * dVar211 +
                     dVar173 * 250.0 * dVar144 + dVar205 * 555.5555555555555 * dVar234 +
                    dVar224 * 250.0 * dVar234 +
                    dVar154 * 450.0 * dVar144 +
                    dVar114 * 22.22222222222222 * dVar143 +
                    dVar32 * 5.555555555555555 * dVar143 +
                    dVar75 * 116.66666666666667 * dVar195 +
                    dVar116 * 200.0 * dVar244 +
                    dVar201 * 83.33333333333333 * dVar194 +
                    dVar128 * 83.33333333333333 * dVar244 +
                    dVar206 * 138.88888888888889 * dVar194 +
                    dVar226 * 55.55555555555556 * dVar233 +
                    dVar150 * 55.55555555555556 * dVar194 +
                    dVar212 * 33.333333333333336 * dVar101 + dVar91 * 88.88888888888889 * dVar233 +
                    dVar34 * 33.333333333333336 * dVar233 +
                    dVar115 * 50.0 * dVar101 +
                    dVar225 * 16.666666666666668 * dVar143 +
                    dVar32 * -4.444444444444445 * dVar182 * dVar218 +
                    dVar205 * -44.44444444444444 * dVar193 +
                    dVar224 * -40.0 * dVar193 +
                    dVar154 * -40.0 * dVar192 +
                    dVar145 * -35.55555555555556 * dVar192 +
                    dVar127 * -35.55555555555556 * dVar191 +
                    dVar174 * -31.11111111111111 * dVar191 +
                    dVar156 * -31.11111111111111 * dVar190 +
                    dVar75 * -26.666666666666668 * dVar190 +
                    dVar128 * -22.22222222222222 * dVar210 + dVar116 * -26.666666666666668 * dVar210
                    + dVar206 * -22.22222222222222 * dVar189 +
                      dVar150 * -17.77777777777778 * dVar189 +
                      dVar91 * -17.77777777777778 * dVar209 +
                      dVar243 * dVar239 * dVar235 * -48.888888888888886 * dVar182 +
                      dVar133 * -48.888888888888886 * dVar188 +
                      dVar76 * -44.44444444444444 * dVar188 +
                      dVar34 * -13.333333333333334 * dVar209 +
                      dVar115 * -13.333333333333334 * dVar208 +
                      dVar222 * -8.88888888888889 * dVar208 +
                      dVar114 * -8.88888888888889 * dVar182 * dVar218 +
                      dVar243 * dVar72 * -4.444444444444445 * dVar182 * dVar105 +
                      dVar249 * dVar72 * 5.555555555555555 * dVar28 * dVar106 +
                      dVar249 * dVar1 * 5.555555555555555 * dVar28 * dVar106) * dVar104 * dVar67 *
                    dVar37 + dVar162 * 0.008073807217768219 * dVar132 * dVar159 +
                             dVar90 * -0.25 +
                             dVar242 * 0.0026912690725894063 +
                             dVar27 * -0.75 * dVar158 +
                             dVar113 * dVar131 * 0.008073807217768219 * dVar155 +
                             dVar170 * dVar109 + dVar27 * dVar92 * -0.25 + dVar87 +
                             dVar219 * 0.00019692461905715026 *
                             (dVar29 / (dVar123 * dVar163)) * local_eb8 * local_eb8 * dVar122 *
                             dVar179 + dVar162 * -0.014801979899241736 *
                                       (dVar70 / dVar123) * local_eb8 * dVar69 * dVar179;
        }
        dVar70 = 1.0 / (dVar38 * dVar38);
        dVar99 = dVar99 * dVar36;
        dVar99 = dVar99 + dVar99;
        dVar36 = -0.0;
        if (dVar24 < local_e48) {
          dVar36 = 0.0;
          if (bVar18 && bVar17) {
            dVar36 = dVar88 + dVar88 + dVar99;
          }
          dVar36 = (dVar36 * dVar240 + dVar70 * 0.4444444444444444 * dVar48 * dVar48) *
                   0.9847450218426964 * -0.375;
        }
        dVar183 = dVar183 * dVar199;
        dVar38 = (dVar45 * dVar100 * dVar39) / 12.0;
        pdVar5 = out->v2rho2;
        bVar15 = pdVar5 != (double *)0x0;
        bVar16 = (uVar4 & 4) != 0;
        if (bVar16 && bVar15) {
          dVar45 = 0.0;
          if ((unaff_R15D & 1) == 0) {
            dVar45 = dVar36 * dVar112 + dVar183 * -0.25 + dVar38;
          }
          lVar9 = (long)(p->dim).v2rho2 * sVar14;
          pdVar5[lVar9] =
               (dVar244 + dVar45) * dVar65 + local_8e8 + local_8e8 + dVar207 + dVar207 +
               pdVar5[lVar9];
        }
        dVar36 = -0.0;
        if (dVar24 < dVar176) {
          dVar36 = 0.0;
          if (bVar18 && bVar17) {
            dVar36 = dVar147;
          }
          dVar36 = (dVar26 * dVar117 * 0.4444444444444444 * dVar47 + dVar36 * dVar89) *
                   0.9847450218426964 * -0.375;
        }
        dVar66 = dVar92 * dVar66;
        dVar184 = dVar184 * 1.4422495703074083;
        dVar244 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          dVar244 = dVar90 * -0.125 +
                    dVar242 * 0.0013456345362947032 +
                    dVar27 * dVar92 * -0.125 +
                    dVar158 * dVar50 +
                    dVar131 * dVar184 * 0.0040369036088841095 * dVar155 +
                    dVar36 * dVar109 + dVar66 * -0.125 + dVar87;
        }
        dVar36 = -0.0;
        if (dVar24 < local_e48) {
          dVar36 = 0.0;
          if (bVar18 && bVar17) {
            dVar36 = dVar99;
          }
          dVar36 = (dVar160 * dVar70 * 0.4444444444444444 * dVar48 + dVar36 * dVar240) *
                   0.9847450218426964 * -0.375;
        }
        dVar214 = dVar214 * 1.4422495703074083;
        dVar47 = dVar185 * dVar157 * dVar169 * dVar142;
        dVar92 = dVar79 * dVar134 * dVar157 * dVar39;
        dVar45 = 0.0;
        if ((unaff_R15D & 1) == 0) {
          dVar45 = dVar92 * -0.125 +
                   dVar49 * dVar53 +
                   dVar47 * 0.0013456345362947032 +
                   dVar165 * dVar214 * 0.0040369036088841095 * dVar142 +
                   dVar183 * -0.125 + dVar36 * dVar112 + dVar199 * dVar51 * -0.125 + dVar38;
        }
        if (bVar16 && bVar15) {
          lVar9 = (long)(p->dim).v2rho2 * sVar14;
          pdVar5[lVar9 + 1] =
               (dVar244 + dVar45) * dVar65 + local_8e8 + dVar207 + local_668 + dVar232 +
               pdVar5[lVar9 + 1];
        }
        dVar36 = -0.0;
        if (dVar24 < dVar176) {
          dVar176 = 0.0;
          if (bVar18 && bVar17) {
            dVar176 = dVar88 + dVar88 + dVar147;
          }
          dVar36 = (dVar89 * dVar176 + dVar26 * 0.4444444444444444 * dVar117 * dVar117) *
                   0.9847450218426964 * -0.375;
        }
        dVar176 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          dVar176 = dVar87 + dVar36 * dVar109 + dVar66 * -0.25;
        }
        dVar66 = -0.0;
        if (dVar24 < local_e48) {
          dVar24 = 0.0;
          if (bVar18 && bVar17) {
            dVar24 = dVar99 - (dVar88 + dVar88);
          }
          dVar66 = (dVar24 * dVar240 + dVar70 * 0.4444444444444444 * dVar160 * dVar160) *
                   0.9847450218426964 * -0.375;
        }
        dVar26 = dVar77 * dVar77;
        dVar40 = 1.0 / dVar40;
        dVar147 = dVar40 / (__x * dVar26);
        dVar57 = dVar57 * dVar213;
        dVar24 = dVar246 / (dVar200 * dVar245);
        dVar31 = dVar31 * dVar229;
        dVar58 = dVar58 * dVar180;
        dVar59 = dVar59 * dVar181;
        dVar60 = dVar60 * dVar152;
        dVar61 = dVar61 * dVar202;
        dVar25 = dVar25 * dVar108;
        dVar62 = dVar62 * dVar203;
        dVar250 = dVar250 * 1.4422495703074083;
        dVar63 = dVar63 * dVar230;
        dVar36 = dVar67 * (dVar185 / dVar78) * dVar169;
        if (bVar16 && bVar15) {
          dVar70 = local_d98 * local_d98;
          dVar200 = 0.0;
          if ((unaff_R15D & 1) == 0) {
            dVar200 = dVar70 * dVar129 * dVar147;
            dVar229 = dVar70 * dVar248 * dVar147;
            dVar230 = local_d98 * dVar248 * dVar167;
            dVar131 = dVar70 * dVar204 * dVar147;
            dVar244 = local_d98 * dVar204 * dVar167;
            dVar87 = dVar70 * dVar217 * dVar147;
            dVar109 = local_d98 * dVar85 * dVar167;
            dVar202 = local_d98 * dVar129 * dVar167;
            dVar181 = local_d98 * dVar151 * dVar167;
            dVar88 = dVar70 * dVar151 * dVar147;
            dVar203 = local_d98 * dVar86 * dVar167;
            dVar245 = dVar70 * dVar186 * dVar147;
            dVar213 = dVar70 * dVar85 * dVar147;
            dVar45 = dVar70 * dVar86 * dVar147;
            dVar155 = local_d98 * dVar246 * dVar167;
            dVar89 = dVar70 * dVar246 * dVar147;
            dVar152 = local_d98 * dVar223 * dVar167;
            dVar180 = dVar70 * dVar223 * dVar147;
            dVar108 = local_d98 * dVar217 * dVar167;
            dVar200 = (dVar42 * 155.55555555555554 * dVar229 +
                       dVar164 * 272.22222222222223 * dVar89 +
                       dVar58 * 116.66666666666667 * dVar180 +
                       dVar89 * dVar238 * 116.66666666666667 +
                       dVar137 * 200.0 * dVar180 +
                       dVar31 * 83.33333333333333 * dVar87 +
                       dVar237 * 83.33333333333333 * dVar180 +
                       dVar147 * dVar44 * 366.6666666666667 * dVar70 * dVar24 +
                       dVar168 * 672.2222222222222 * dVar245 +
                       dVar57 * 305.55555555555554 * dVar88 +
                       dVar167 * dVar146 * dVar241 * -8.88888888888889 +
                       dVar130 * -35.55555555555556 * dVar230 +
                       dVar80 * -4.444444444444445 * dVar167 * dVar146 +
                       dVar59 * 155.55555555555554 * dVar89 +
                       dVar42 * -31.11111111111111 * dVar155 +
                       dVar164 * -31.11111111111111 * dVar152 +
                       dVar238 * -26.666666666666668 * dVar152 +
                       dVar108 * dVar137 * -26.666666666666668 +
                       dVar237 * -22.22222222222222 * dVar108 +
                       dVar52 * -22.22222222222222 * dVar244 +
                       dVar236 * -17.77777777777778 * dVar244 +
                       dVar203 * dVar135 * -17.77777777777778 +
                       dVar84 * -13.333333333333334 * dVar203 +
                       dVar70 * dVar1 * 5.555555555555555 * dVar83 * dVar147 +
                       dVar81 * local_d98 * dVar72 * -4.444444444444445 * dVar167 +
                       dVar70 * dVar72 * 5.555555555555555 * dVar83 * dVar147 +
                       dVar139 * -35.55555555555556 * dVar155 +
                       dVar135 * 88.88888888888889 * dVar131 +
                       dVar45 * dVar25 * 33.333333333333336 +
                       dVar84 * 33.333333333333336 * dVar131 +
                       dVar247 * 50.0 * dVar45 +
                       dVar213 * dVar61 * 16.666666666666668 +
                       dVar82 * 16.666666666666668 * dVar45 +
                       dVar241 * 22.22222222222222 * dVar213 +
                       dVar80 * 5.555555555555555 * dVar213 +
                       dVar88 * dVar43 * 250.0 +
                       dVar166 * 450.0 * dVar200 +
                       dVar60 * 200.0 * dVar229 +
                       dVar139 * 355.55555555555554 * dVar229 + dVar130 * 200.0 * dVar200 +
                      dVar153 * 305.55555555555554 * dVar245 +
                      dVar141 * 555.5555555555555 * dVar88 +
                      dVar200 * dVar63 * 250.0 +
                      dVar44 * -48.888888888888886 * local_d98 * dVar186 * dVar167 +
                      dVar181 * dVar168 * -48.888888888888886 +
                      dVar153 * -44.44444444444444 * dVar181 +
                      dVar202 * dVar141 * -44.44444444444444 +
                      dVar43 * -40.0 * dVar202 +
                      dVar230 * dVar166 * -40.0 +
                      dVar247 * -13.333333333333334 * dVar109 +
                      dVar82 * -8.88888888888889 * dVar109 +
                      dVar52 * 138.88888888888889 * dVar87 +
                      dVar236 * 55.55555555555556 * dVar87 + dVar62 * 55.55555555555556 * dVar131) *
                      dVar79 * dVar67 * dVar46 +
                      dVar92 * -0.25 +
                      dVar47 * 0.0026912690725894063 +
                      dVar38 + dVar51 * -0.75 * dVar53 +
                               dVar165 * dVar250 * 0.008073807217768219 * dVar142 +
                               dVar66 * dVar112 + dVar199 * dVar51 * -0.25 +
                      dVar36 * 0.00019692461905715026 *
                      local_f30 * local_f30 * (dVar40 / (dVar26 * dVar138)) * dVar122 * dVar111 +
                      dVar136 * -0.014801979899241736 *
                      dVar69 * (dVar227 / dVar26) * local_f30 * dVar111 +
                      dVar140 * dVar134 * dVar136 * 0.008073807217768219;
          }
          lVar9 = (long)(p->dim).v2rho2 * sVar14;
          pdVar5[lVar9 + 2] =
               (dVar176 + dVar200) * dVar65 + local_668 + local_668 + dVar232 + dVar232 +
               pdVar5[lVar9 + 2];
        }
        dVar66 = dVar161 * dVar157 * 0.0005046129511105137 * dVar93;
        dVar176 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          dVar176 = dVar159 * dVar110 * dVar54 +
                    dVar94 * 0.0040369036088841095 *
                    dVar182 * dVar68 * dVar231 * 1.8171205928321397 * dVar179 +
                    dVar219 * -7.384673214643134e-05 *
                    local_eb8 * (dVar29 / (dVar103 * dVar123)) * dVar122 * dVar179 +
                    (dVar113 * dVar67 * -0.0015138388533315413 * dVar93 - dVar66);
        }
        bVar17 = (uVar4 & 4) != 0;
        pdVar5 = out->v2rhosigma;
        bVar18 = pdVar5 != (double *)0x0;
        if (bVar18 && bVar17) {
          lVar9 = (long)(p->dim).v2rhosigma * sVar14;
          dVar199 = (pdVar5 + lVar9)[1];
          pdVar5[lVar9] = dVar176 * dVar65 + dVar118 + pdVar5[lVar9];
          (pdVar5 + lVar9)[1] = dVar199 + 0.0;
        }
        dVar199 = dVar169 * dVar157 * 0.0005046129511105137 * dVar119;
        dVar176 = 0.0;
        if ((unaff_R15D & 1) == 0) {
          dVar176 = dVar214 * dVar67 * -0.0015138388533315413 * dVar119 - dVar199;
        }
        if (bVar18 && bVar17) {
          lVar9 = (long)(p->dim).v2rhosigma * sVar14;
          pdVar5[lVar9 + 2] = dVar176 * dVar65 + dVar96 + pdVar5[lVar9 + 2];
        }
        dVar176 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          dVar176 = dVar184 * dVar67 * -0.0015138388533315413 * dVar93 - dVar66;
        }
        if (bVar18 && bVar17) {
          lVar9 = (long)(p->dim).v2rhosigma * sVar14;
          dVar66 = (pdVar5 + lVar9 + 3)[1];
          pdVar5[lVar9 + 3] = dVar176 * dVar65 + dVar118 + pdVar5[lVar9 + 3];
          (pdVar5 + lVar9 + 3)[1] = dVar66 + 0.0;
        }
        dVar176 = 0.0;
        if ((unaff_R15D & 1) == 0) {
          dVar176 = dVar134 * dVar55 * dVar56 +
                    dVar95 * 0.0040369036088841095 *
                    dVar68 * dVar167 * dVar185 * 1.8171205928321397 * dVar111 +
                    dVar36 * -7.384673214643134e-05 *
                    dVar122 * (dVar40 / (dVar77 * dVar26)) * dVar111 * local_f30 +
                    (dVar250 * dVar67 * -0.0015138388533315413 * dVar119 - dVar199);
        }
        if (bVar18 && bVar17) {
          lVar9 = (long)(p->dim).v2rhosigma * sVar14;
          pdVar5[lVar9 + 5] = dVar176 * dVar65 + dVar96 + pdVar5[lVar9 + 5];
        }
        pdVar5 = out->v2rholapl;
        uVar10 = uVar4 & 0x8004;
        if (uVar10 == 0x8004 && pdVar5 != (double *)0x0) {
          lVar9 = (long)(p->dim).v2rholapl * sVar14;
          dVar176 = (pdVar5 + lVar9)[1];
          dVar66 = pdVar5[lVar9 + 2];
          dVar199 = (pdVar5 + lVar9 + 2)[1];
          pdVar5[lVar9] = pdVar5[lVar9] + 0.0;
          (pdVar5 + lVar9)[1] = dVar176 + 0.0;
          pdVar5[lVar9 + 2] = dVar66 + 0.0;
          (pdVar5 + lVar9 + 2)[1] = dVar199 + 0.0;
        }
        dVar176 = dVar107 * dVar104 * dVar120 * dVar157 * 0.125;
        dVar66 = 0.0;
        if ((uVar7 & 0x7f) == 0) {
          dVar123 = dVar29 / dVar123;
          dVar200 = dVar123 * dVar178 * dVar243;
          dVar69 = dVar123 * local_9b8 * dVar243;
          dVar107 = dVar123 * local_9a8 * dVar243;
          dVar66 = dVar198 * dVar123 * dVar243;
          dVar70 = dVar123 * dVar73 * dVar243;
          dVar161 = dVar215 * dVar123 * dVar243;
          dVar199 = dVar175 * dVar123 * dVar243;
          dVar36 = dVar123 * dVar239 * dVar243;
          dVar68 = dVar123 * dVar33 * dVar243;
          dVar103 = dVar123 * local_b58 * dVar243;
          dVar66 = (dVar156 * -163.33333333333334 * dVar200 +
                    dVar149 * -70.0 * dVar107 +
                    dVar123 * dVar30 * dVar235 * -220.0 * dVar243 +
                    dVar128 * -50.0 * dVar107 +
                    dVar206 * -83.33333333333333 * dVar69 +
                    dVar103 * dVar226 * -33.333333333333336 +
                    dVar150 * -33.333333333333336 * dVar69 +
                    dVar91 * -53.333333333333336 * dVar103 +
                    dVar68 * dVar212 * -20.0 +
                    dVar34 * -20.0 * dVar103 +
                    dVar115 * -30.0 * dVar68 +
                    dVar225 * -10.0 * dVar70 +
                    dVar114 * -13.333333333333334 * dVar70 + dVar222 * -10.0 * dVar68 +
                   dVar36 * dVar133 * -403.3333333333333 +
                   dVar199 * dVar216 * -183.33333333333334 +
                   dVar76 * -183.33333333333334 * dVar36 +
                   dVar205 * -333.3333333333333 * dVar199 +
                   dVar161 * dVar173 * -150.0 +
                   dVar224 * -150.0 * dVar199 +
                   dVar154 * -270.0 * dVar161 +
                   dVar66 * dVar35 * -120.0 +
                   dVar145 * -120.0 * dVar161 +
                   dVar127 * -213.33333333333334 * dVar66 +
                   dVar74 * -93.33333333333333 * dVar200 +
                   dVar32 * -3.3333333333333335 * dVar70 + dVar174 * -93.33333333333333 * dVar66 +
                   dVar34 * 5.0 * dVar33 * dVar71 +
                   dVar115 * 5.0 * dVar73 * dVar71 +
                   dVar73 * dVar71 * dVar222 * 3.3333333333333335 +
                   dVar133 * 18.333333333333332 * dVar175 * dVar71 +
                   dVar76 * 16.666666666666668 * dVar175 * dVar71 +
                   dVar205 * 16.666666666666668 * dVar215 * dVar71 +
                   dVar224 * 15.0 * dVar215 * dVar71 +
                   dVar154 * 15.0 * dVar198 * dVar71 +
                   dVar145 * 13.333333333333334 * dVar198 * dVar71 +
                   dVar127 * 13.333333333333334 * dVar178 * dVar71 +
                   dVar174 * 11.666666666666666 * dVar178 * dVar71 +
                   dVar235 * 18.333333333333332 * dVar239 * dVar71 +
                   dVar156 * 11.666666666666666 * dVar71 * local_9a8 +
                   dVar200 * dVar75 * -70.0 +
                   dVar107 * dVar116 * -120.0 +
                   dVar201 * -50.0 * dVar69 +
                   dVar105 * dVar72 * 1.6666666666666667 * dVar71 +
                   dVar106 * dVar243 * dVar1 * -3.3333333333333335 * dVar123 +
                   dVar218 * dVar123 * dVar72 * -3.3333333333333335 +
                   dVar114 * 3.3333333333333335 * dVar106 * dVar71 +
                   dVar32 * 1.6666666666666667 * dVar106 * dVar71 +
                   dVar75 * 10.0 * dVar71 * local_9a8 +
                   dVar116 * 10.0 * local_9b8 * dVar71 +
                   dVar128 * 8.333333333333334 * local_9b8 * dVar71 +
                   dVar71 * local_b58 * dVar206 * 8.333333333333334 +
                   dVar91 * 6.666666666666667 * dVar33 * dVar71 +
                   dVar150 * 6.666666666666667 * dVar71 * local_b58) * dVar104 * dVar67 * dVar37 +
                   dVar162 * 0.0040369036088841095 * dVar132 * dVar120 +
                   (dVar27 * -0.375 * dVar177 - dVar176);
        }
        pdVar5 = out->v2rhotau;
        uVar12 = uVar4 & 0x10004;
        if (uVar12 != 0x10004 || pdVar5 == (double *)0x0) {
          local_d28 = dVar39 * dVar121 * dVar157 * -0.125;
        }
        else {
          lVar9 = (long)(p->dim).v2rhotau * sVar14;
          pdVar5[lVar9] = dVar66 * dVar65 + dVar97 + pdVar5[lVar9];
          local_d28 = dVar39 * dVar121 * dVar157 * -0.125;
          lVar9 = (long)(p->dim).v2rhotau * sVar14;
          dVar66 = (pdVar5 + lVar9 + 1)[1];
          pdVar5[lVar9 + 1] =
               pdVar5[lVar9 + 1] +
               dVar187 + dVar65 * (double)(-(ulong)(dVar125 < __x) &
                                          (ulong)(local_d28 + dVar228 * dVar49));
          (pdVar5 + lVar9 + 1)[1] =
               dVar66 + dVar97 + dVar65 * (double)(-(ulong)(dVar125 < dVar23) &
                                                  (ulong)(-dVar176 + dVar177 * dVar50));
        }
        dVar23 = 0.0;
        if ((unaff_R15D & 1) == 0) {
          dVar26 = dVar40 / dVar26;
          dVar27 = dVar26 * dVar217 * local_d98;
          dVar125 = dVar26 * dVar186 * local_d98;
          dVar66 = dVar26 * dVar85 * local_d98;
          dVar200 = dVar26 * dVar223 * local_d98;
          dVar199 = dVar26 * dVar204 * local_d98;
          dVar69 = dVar26 * dVar246 * local_d98;
          dVar36 = dVar26 * dVar248 * local_d98;
          dVar68 = dVar26 * dVar129 * local_d98;
          dVar23 = dVar26 * dVar86 * local_d98;
          dVar176 = dVar26 * dVar151 * local_d98;
          dVar23 = (dVar176 * dVar57 * -183.33333333333334 +
                    dVar153 * -183.33333333333334 * dVar125 +
                    dVar141 * -333.3333333333333 * dVar176 +
                    dVar63 * -150.0 * dVar68 +
                    dVar43 * -150.0 * dVar176 +
                    dVar166 * -270.0 * dVar68 +
                    dVar60 * -120.0 * dVar36 +
                    dVar135 * -53.333333333333336 * dVar199 +
                    dVar23 * dVar25 * -20.0 +
                    dVar84 * -20.0 * dVar199 +
                    dVar247 * -30.0 * dVar23 +
                    dVar61 * -10.0 * dVar66 +
                    dVar241 * -13.333333333333334 * dVar66 + dVar82 * -10.0 * dVar23 +
                   dVar80 * -3.3333333333333335 * dVar66 +
                   dVar130 * -120.0 * dVar68 +
                   dVar139 * -213.33333333333334 * dVar36 +
                   dVar69 * dVar59 * -93.33333333333333 +
                   dVar42 * -93.33333333333333 * dVar36 +
                   dVar164 * -163.33333333333334 * dVar69 +
                   dVar200 * dVar58 * -70.0 +
                   dVar238 * -70.0 * dVar69 +
                   dVar137 * -120.0 * dVar200 +
                   dVar31 * -50.0 * dVar27 +
                   dVar237 * -50.0 * dVar200 +
                   dVar62 * -33.333333333333336 * dVar199 + dVar52 * -83.33333333333333 * dVar27 +
                   dVar236 * -33.333333333333336 * dVar27 +
                   dVar26 * dVar24 * dVar44 * -220.0 * local_d98 +
                   dVar168 * -403.3333333333333 * dVar125 +
                   dVar72 * 1.6666666666666667 * dVar41 * dVar81 +
                   dVar72 * dVar26 * -3.3333333333333335 * dVar146 +
                   local_d98 * dVar1 * -3.3333333333333335 * dVar26 * dVar83 +
                   dVar135 * 6.666666666666667 * dVar41 * dVar86 +
                   dVar84 * 5.0 * dVar41 * dVar86 +
                   dVar247 * 5.0 * dVar41 * dVar85 +
                   dVar82 * 3.3333333333333335 * dVar41 * dVar85 +
                   dVar241 * 3.3333333333333335 * dVar41 * dVar83 +
                   dVar80 * 1.6666666666666667 * dVar41 * dVar83 +
                   dVar139 * 13.333333333333334 * dVar41 * dVar246 +
                   dVar130 * 13.333333333333334 * dVar41 * dVar248 +
                   dVar42 * 11.666666666666666 * dVar41 * dVar246 +
                   dVar164 * 11.666666666666666 * dVar41 * dVar223 +
                   dVar238 * 10.0 * dVar41 * dVar223 +
                   dVar137 * 10.0 * dVar41 * dVar217 +
                   dVar237 * 8.333333333333334 * dVar41 * dVar217 +
                   dVar52 * 8.333333333333334 * dVar41 * dVar204 +
                   dVar236 * 6.666666666666667 * dVar41 * dVar204 +
                   dVar44 * 18.333333333333332 * dVar186 * dVar41 +
                   dVar168 * 18.333333333333332 * dVar41 * dVar151 +
                   dVar153 * 16.666666666666668 * dVar41 * dVar151 +
                   dVar141 * 16.666666666666668 * dVar41 * dVar129 +
                   dVar166 * 15.0 * dVar41 * dVar248 + dVar43 * 15.0 * dVar41 * dVar129) * dVar79 *
                   dVar67 * dVar46 +
                   dVar136 * 0.0040369036088841095 * dVar140 * dVar98 +
                   dVar51 * -0.375 * dVar228 + local_d28;
        }
        if (uVar12 == 0x10004 && pdVar5 != (double *)0x0) {
          lVar9 = (long)(p->dim).v2rhotau * sVar14;
          pdVar5[lVar9 + 3] = dVar23 * dVar65 + dVar187 + pdVar5[lVar9 + 3];
        }
        pdVar5 = out->v2sigma2;
        if (pdVar5 != (double *)0x0 && (uVar4 & 4) != 0) {
          dVar23 = 0.0;
          dVar125 = 0.0;
          if ((uVar7 & 0x7f) == 0) {
            dVar125 = auVar172._8_8_ * 3.3019272488946267 * dVar148 * dVar28 * dVar179 *
                      dVar94 * 2.7692524554911753e-05;
          }
          lVar9 = (long)(p->dim).v2sigma2 * sVar14;
          dVar176 = (pdVar5 + lVar9)[1];
          dVar66 = pdVar5[lVar9 + 2];
          dVar146 = (pdVar5 + lVar9 + 2)[1];
          pdVar5[lVar9] = pdVar5[lVar9] + dVar125 * dVar65;
          (pdVar5 + lVar9)[1] = dVar176 + 0.0;
          pdVar5[lVar9 + 2] = dVar66 + 0.0;
          (pdVar5 + lVar9 + 2)[1] = dVar146 + 0.0;
          pdVar5[lVar9 + 4] = pdVar5[lVar9 + 4] + 0.0;
          if ((unaff_R15D & 1) == 0) {
            dVar23 = dVar147 * dVar148 * (dVar185 / dVar78) * 3.3019272488946267 * dVar111 *
                     dVar95 * 2.7692524554911753e-05;
          }
          lVar9 = (long)(p->dim).v2sigma2 * sVar14;
          pdVar5[lVar9 + 5] = dVar23 * dVar65 + pdVar5[lVar9 + 5];
        }
        pdVar5 = out->v2sigmalapl;
        if (pdVar5 != (double *)0x0 && uVar10 == 0x8004) {
          lVar9 = (long)(p->dim).v2sigmalapl * sVar14;
          dVar23 = (pdVar5 + lVar9)[1];
          dVar125 = pdVar5[lVar9 + 2];
          dVar176 = (pdVar5 + lVar9 + 2)[1];
          dVar66 = pdVar5[lVar9 + 4];
          dVar146 = (pdVar5 + lVar9 + 4)[1];
          pdVar5[lVar9] = pdVar5[lVar9] + 0.0;
          (pdVar5 + lVar9)[1] = dVar23 + 0.0;
          pdVar5[lVar9 + 2] = dVar125 + 0.0;
          (pdVar5 + lVar9 + 2)[1] = dVar176 + 0.0;
          pdVar5[lVar9 + 4] = dVar66 + 0.0;
          (pdVar5 + lVar9 + 4)[1] = dVar146 + 0.0;
        }
        pdVar5 = out->v2sigmatau;
        if (pdVar5 != (double *)0x0 && uVar12 == 0x10004) {
          dVar23 = 0.0;
          dVar125 = 0.0;
          if ((uVar7 & 0x7f) == 0) {
            dVar125 = dVar54 * dVar110 * dVar120;
          }
          lVar9 = (long)(p->dim).v2sigmatau * sVar14;
          dVar176 = (pdVar5 + lVar9)[1];
          dVar66 = pdVar5[lVar9 + 2];
          dVar146 = (pdVar5 + lVar9 + 2)[1];
          dVar147 = pdVar5[lVar9 + 4];
          dVar199 = (pdVar5 + lVar9 + 4)[1];
          pdVar5[lVar9] = pdVar5[lVar9] + dVar125 * dVar65;
          (pdVar5 + lVar9)[1] = dVar176 + 0.0;
          pdVar5[lVar9 + 2] = dVar66 + 0.0;
          (pdVar5 + lVar9 + 2)[1] = dVar146 + 0.0;
          if ((unaff_R15D & 1) == 0) {
            dVar23 = dVar56 * dVar55 * dVar98;
          }
          pdVar5[lVar9 + 4] = dVar147 + 0.0;
          (pdVar5 + lVar9 + 4)[1] = dVar23 * dVar65 + dVar199;
        }
        pdVar5 = out->v2lapl2;
        if (pdVar5 != (double *)0x0 && uVar10 == 0x8004) {
          lVar9 = (long)(p->dim).v2lapl2 * sVar14;
          dVar23 = (pdVar5 + lVar9)[1];
          pdVar5[lVar9] = pdVar5[lVar9] + 0.0;
          (pdVar5 + lVar9)[1] = dVar23 + 0.0;
          pdVar5[lVar9 + 2] = pdVar5[lVar9 + 2] + 0.0;
        }
        pdVar5 = out->v2lapltau;
        if ((uVar8 & 0x18004) == 0 && pdVar5 != (double *)0x0) {
          lVar9 = (long)(p->dim).v2lapltau * sVar14;
          dVar23 = (pdVar5 + lVar9)[1];
          dVar125 = pdVar5[lVar9 + 2];
          dVar176 = (pdVar5 + lVar9 + 2)[1];
          pdVar5[lVar9] = pdVar5[lVar9] + 0.0;
          (pdVar5 + lVar9)[1] = dVar23 + 0.0;
          pdVar5[lVar9 + 2] = dVar125 + 0.0;
          (pdVar5 + lVar9 + 2)[1] = dVar176 + 0.0;
        }
        pdVar5 = out->v2tau2;
        if (pdVar5 != (double *)0x0 && uVar12 == 0x10004) {
          dVar23 = 0.0;
          if ((uVar7 & 0x7f) == 0) {
            dVar29 = dVar29 / dVar163;
            dVar178 = dVar178 * dVar29;
            local_9a8 = local_9a8 * dVar29;
            dVar175 = dVar175 * dVar29;
            local_9b8 = local_9b8 * dVar29;
            dVar215 = dVar215 * dVar29;
            local_b58 = local_b58 * dVar29;
            dVar198 = dVar198 * dVar29;
            dVar33 = dVar33 * dVar29;
            dVar73 = dVar73 * dVar29;
            dVar23 = dVar37 * dVar104 * (dVar133 * 242.0 * dVar239 * dVar29 +
                                         dVar216 * 110.0 * dVar175 +
                                         dVar205 * 200.0 * dVar175 +
                                         dVar145 * 72.0 * dVar215 +
                                         dVar173 * 90.0 * dVar215 +
                                         dVar154 * 162.0 * dVar215 +
                                         dVar174 * 56.0 * dVar198 +
                                         dVar35 * 72.0 * dVar198 +
                                         dVar127 * 128.0 * dVar198 +
                                         dVar74 * 56.0 * dVar178 +
                                         dVar225 * 6.0 * dVar73 +
                                         dVar76 * 110.0 * dVar239 * dVar29 +
                                         dVar224 * 90.0 * dVar175 +
                                         dVar106 * (dVar1 + dVar1) * dVar29 +
                                         dVar29 * dVar30 * dVar235 * 132.0 +
                                         dVar106 * (dVar72 + dVar72) * dVar29 +
                                        dVar75 * 42.0 * dVar178 +
                                        dVar156 * 98.0 * dVar178 +
                                        dVar149 * 42.0 * local_9a8 +
                                        dVar128 * 30.0 * local_9a8 +
                                        dVar116 * 72.0 * local_9a8 +
                                        dVar201 * 30.0 * local_9b8 +
                                        dVar150 * 20.0 * local_9b8 +
                                        dVar206 * 50.0 * local_9b8 +
                                        dVar226 * 20.0 * local_b58 +
                                        dVar34 * 12.0 * local_b58 +
                                        dVar91 * 32.0 * local_b58 +
                                        dVar212 * 12.0 * dVar33 +
                                        dVar222 * 6.0 * dVar33 +
                                        dVar115 * 18.0 * dVar33 +
                                        dVar73 * dVar114 * 8.0 + (dVar32 + dVar32) * dVar73) *
                              dVar67;
          }
          dVar176 = 0.0;
          lVar9 = (long)(p->dim).v2tau2 * sVar14;
          dVar125 = (pdVar5 + lVar9)[1];
          pdVar5[lVar9] = dVar23 * dVar65 + pdVar5[lVar9];
          (pdVar5 + lVar9)[1] = dVar125 + 0.0;
          if ((unaff_R15D & 1) == 0) {
            dVar40 = dVar40 / dVar138;
            dVar151 = dVar151 * dVar40;
            dVar217 = dVar217 * dVar40;
            dVar223 = dVar223 * dVar40;
            dVar246 = dVar246 * dVar40;
            dVar248 = dVar248 * dVar40;
            dVar85 = dVar85 * dVar40;
            dVar86 = dVar86 * dVar40;
            dVar204 = dVar204 * dVar40;
            dVar129 = dVar129 * dVar40;
            dVar176 = dVar46 * dVar67 * dVar79 * (dVar168 * 242.0 * dVar186 * dVar40 +
                                                  dVar153 * 110.0 * dVar186 * dVar40 +
                                                  dVar237 * 30.0 * dVar223 +
                                                  dVar52 * 50.0 * dVar217 +
                                                  dVar135 * 32.0 * dVar204 +
                                                  dVar247 * 18.0 * dVar86 +
                                                  dVar241 * 8.0 * dVar85 +
                                                  dVar141 * 200.0 * dVar151 +
                                                  dVar43 * 90.0 * dVar151 +
                                                  dVar236 * 20.0 * dVar217 +
                                                  dVar84 * 12.0 * dVar204 +
                                                  dVar82 * 6.0 * dVar86 +
                                                  (dVar80 + dVar80) * dVar85 +
                                                  (dVar1 + dVar1) * dVar40 * dVar83 +
                                                  dVar24 * dVar44 * 132.0 * dVar40 +
                                                  (dVar72 + dVar72) * dVar40 * dVar83 +
                                                 dVar164 * 98.0 * dVar246 +
                                                 dVar238 * 42.0 * dVar246 +
                                                 dVar137 * 72.0 * dVar223 +
                                                 dVar166 * 162.0 * dVar129 +
                                                 dVar130 * 72.0 * dVar129 +
                                                 dVar139 * 128.0 * dVar248 +
                                                 dVar42 * 56.0 * dVar248 +
                                                 dVar63 * 90.0 * dVar129 +
                                                 dVar62 * 20.0 * dVar204 +
                                                 dVar25 * 12.0 * dVar86 +
                                                 dVar61 * 6.0 * dVar85 +
                                                 dVar60 * 72.0 * dVar248 +
                                                 dVar59 * 56.0 * dVar246 +
                                                 dVar58 * 42.0 * dVar223 +
                                                 dVar57 * 110.0 * dVar151 + dVar31 * 30.0 * dVar217)
            ;
          }
          lVar9 = (long)(p->dim).v2tau2 * sVar14;
          pdVar5[lVar9 + 2] = dVar65 * dVar176 + pdVar5[lVar9 + 2];
        }
      }
      sVar14 = sVar14 + 1;
      pdVar13 = pdVar13 + iVar3;
    } while (np != sVar14);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}